

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

bool CheckTag(HSQUIRRELVM v,SQWRITEFUNC read,SQUserPointer up,SQUnsignedInteger32 tag)

{
  bool bVar1;
  int in_ECX;
  SQUserPointer in_RDX;
  SQUserPointer in_RSI;
  SQVM *in_RDI;
  SQUnsignedInteger32 t;
  int in_stack_ffffffffffffffd8;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = SafeRead((HSQUIRRELVM)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                   (SQWRITEFUNC)in_RDI,in_RSI,in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffd8));
  if (bVar1) {
    if (in_stack_ffffffffffffffd8 == in_ECX) {
      bVar1 = true;
    }
    else {
      SQVM::Raise_Error(in_RDI,"invalid or corrupted closure stream");
      bVar1 = false;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool CheckTag(HSQUIRRELVM v,SQWRITEFUNC read,SQUserPointer up,SQUnsignedInteger32 tag)
{
    SQUnsignedInteger32 t;
    _CHECK_IO(SafeRead(v,read,up,&t,sizeof(t)));
    if(t != tag){
        v->Raise_Error(_SC("invalid or corrupted closure stream"));
        return false;
    }
    return true;
}